

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O0

void pbrt::ConnectToDisplayServer(string *host)

{
  thread *ptVar1;
  _func_void *in_stack_00000008;
  thread *in_stack_00000010;
  char *in_stack_00000028;
  int in_stack_00000034;
  char *in_stack_00000038;
  LogLevel in_stack_00000044;
  string *in_stack_000000a8;
  IPCChannel *in_stack_000000b0;
  thread *in_stack_ffffffffffffffe0;
  
  if (channel != (thread *)0x0) {
    LogFatal<char_const(&)[19]>
              (in_stack_00000044,in_stack_00000038,in_stack_00000034,in_stack_00000028,
               (char (*) [19])host);
  }
  ptVar1 = (thread *)operator_new(0x50);
  IPCChannel::IPCChannel(in_stack_000000b0,in_stack_000000a8);
  channel = ptVar1;
  ptVar1 = channel;
  std::thread::thread<void(&)(),,void>(in_stack_00000010,in_stack_00000008);
  std::thread::operator=(in_stack_ffffffffffffffe0,ptVar1);
  std::thread::~thread((thread *)0x4a8eae);
  return;
}

Assistant:

void ConnectToDisplayServer(const std::string &host) {
    CHECK(channel == nullptr);
    channel = new IPCChannel(host);

    updateThread = std::thread(updateDynamicItems);
}